

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tripeaks.c
# Opt level: O0

MovePack * tripeaks_movePackGet(Board *board)

{
  byte bVar1;
  code *pcVar2;
  int iVar3;
  Spot *pSVar4;
  Board *in_RDI;
  undefined1 auVar5 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar6 [16];
  uchar tableauCardRank;
  uchar y;
  uchar i;
  Spot *spot;
  uchar tableauCardRanks [28];
  uchar foundationCardRank;
  Spot *foundation;
  Spot *stock;
  MovePack *movePack;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffff5c;
  MovePack *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  SPOTTYPE fromSpotType;
  MovePack *in_stack_ffffffffffffff70;
  MOVETYPE type;
  uint in_stack_ffffffffffffff80;
  byte local_52;
  byte local_51;
  byte abStack_48 [39];
  byte local_21;
  Spot *local_20;
  Spot *local_18;
  MovePack *local_10;
  Board *local_8;
  
  local_8 = in_RDI;
  local_10 = movePack_create();
  local_18 = board_spotGet(local_8,STOCK,'\0');
  local_20 = board_spotGet(local_8,FOUNDATION,'\0');
  if (local_20->cardsCount == '\0') {
    local_21 = 0;
  }
  else {
    if (SBORROW4((uint)local_20->cardsCount,1)) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    local_21 = local_20->cards[(int)(local_20->cardsCount - 1)]->rank;
  }
  for (local_51 = 0; local_51 < 0x1c; local_51 = local_51 + 1) {
    pSVar4 = board_spotGet(local_8,TABLEAU,local_51);
    if (pSVar4->cardsCount == '\x01') {
      abStack_48[local_51] = (*pSVar4->cards)->rank;
    }
    else {
      abStack_48[local_51] = 0;
    }
  }
  for (local_51 = 0; local_51 < 0x12; local_51 = local_51 + 1) {
    if (abStack_48[local_51] != 0) {
      if (local_51 < 3) {
        local_52 = (char)((uint)local_51 + (uint)local_51) + 3;
        if (SCARRY4((uint)local_51 + (uint)local_51,3)) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
      }
      else if (local_51 < 9) {
        auVar5._0_8_ = (double)local_51;
        auVar5._8_8_ = in_ZMM0._8_8_;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = auVar5._0_8_ * 0.5;
        auVar5 = vroundsd_avx(auVar5,auVar6,10);
        in_ZMM0 = ZEXT1664(auVar5);
        iVar3 = (uint)local_51 + ((int)auVar5._0_8_ & 0xffU);
        local_52 = (char)iVar3 + 4;
        if (SCARRY4(iVar3,4)) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
      }
      else {
        local_52 = local_51 + 9;
        if (SCARRY4((uint)local_51,9)) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
      }
      if (abStack_48[local_52] == 0) {
        if (SCARRY4((uint)local_52,1)) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        if (abStack_48[(int)(local_52 + 1)] == 0) goto LAB_0010745b;
      }
      abStack_48[local_51] = 0;
    }
LAB_0010745b:
  }
  local_51 = 0;
  do {
    fromSpotType = (SPOTTYPE)((ulong)local_10 >> 0x30);
    type = (MOVETYPE)((ulong)local_10 >> 0x38);
    if (0x1b < local_51) {
      if (local_18->cardsCount != '\0') {
        uVar7 = 0xffffffff;
        move_create((MOVETYPE)((ulong)in_stack_ffffffffffffff70 >> 0x38),
                    (SPOTTYPE)((ulong)in_stack_ffffffffffffff70 >> 0x30),
                    (uchar)((ulong)in_stack_ffffffffffffff70 >> 0x28),(int)in_stack_ffffffffffffff70
                    ,type,fromSpotType,in_stack_ffffffffffffff80);
        movePack_add(in_stack_ffffffffffffff60,(Move *)CONCAT44(in_stack_ffffffffffffff5c,uVar7));
      }
      return local_10;
    }
    bVar1 = abStack_48[local_51];
    if (bVar1 != 0) {
      if (SCARRY4((uint)local_21,1)) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      if ((uint)bVar1 != local_21 + 1) {
        in_stack_ffffffffffffff80 = local_21 - 1;
        if (SBORROW4((uint)local_21,1)) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        if ((bVar1 != in_stack_ffffffffffffff80) &&
           ((((gConfig.game)->id == TRIPEAKSSTRICT || ((gConfig.game)->id == TRIPEAKSSTRICTHIDDEN))
            || (((bVar1 != 0xd || (local_21 != 1)) && ((bVar1 != 1 || (local_21 != 0xd))))))))
        goto LAB_00107599;
      }
      uVar7 = 0xffffffff;
      in_stack_ffffffffffffff70 = local_10;
      move_create(type,fromSpotType,(uchar)((ulong)local_10 >> 0x28),(int)local_10,
                  (SPOTTYPE)((ulong)in_stack_ffffffffffffff68 >> 0x38),
                  (uchar)((ulong)in_stack_ffffffffffffff68 >> 0x30),in_stack_ffffffffffffff80);
      movePack_add(in_stack_ffffffffffffff60,(Move *)CONCAT44(in_stack_ffffffffffffff5c,uVar7));
    }
LAB_00107599:
    local_51 = local_51 + 1;
  } while( true );
}

Assistant:

MovePack * tripeaks_movePackGet(Board * board)
{
	MovePack * movePack = movePack_create();
	Spot * stock = board_spotGet(board, STOCK, 0);
	Spot * foundation = board_spotGet(board, FOUNDATION, 0);
	unsigned char foundationCardRank = foundation->cardsCount>0 ? foundation->cards[foundation->cardsCount-1]->rank : 0;
	unsigned char tableauCardRanks[28];
	Spot * spot;
	unsigned char i, y, tableauCardRank;

	// Get our tableau cards
	for(i=0;i<28;i++)
	{
		spot = board_spotGet(board, TABLEAU, i);
		if(spot->cardsCount==1)
			tableauCardRanks[i] = spot->cards[0]->rank;
		else
			tableauCardRanks[i] = 0;
	}

	// Remove those that are covered up by others
	for(i=0;i<=17;i++)
	{
		if(tableauCardRanks[i]==0)
			continue;

		if(i<=2)
			y = i+i+3;
		else if(i<=8)
			y = (i+(unsigned char)ceil((double)i/(double)2)+4);
		else
			y = i+9;

		if(tableauCardRanks[y]!=0 || tableauCardRanks[y+1]!=0)
		{
			tableauCardRanks[i] = 0;
			continue;
		}
	}

	// Tableau->Foundation
	for(i=0;i<28;i++)
	{
		tableauCardRank = tableauCardRanks[i];
		if(tableauCardRank==0)
			continue;

		if(tableauCardRank==foundationCardRank+1 || tableauCardRank==foundationCardRank-1 ||
		   (gConfig.game->id!=TRIPEAKSSTRICT && gConfig.game->id!=TRIPEAKSSTRICTHIDDEN && ((tableauCardRank==13 && foundationCardRank==1) || (tableauCardRank==1 && foundationCardRank==13))))
			movePack_add(movePack, move_create(MOVE, TABLEAU, i, -1, FOUNDATION, 0, -1));
	}

	// Stock->Foundation
	if(stock->cardsCount>0)
		movePack_add(movePack, move_create(MOVE, STOCK, 0, -1, FOUNDATION, 0, -1));

	return movePack;
}